

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

void __thiscall mocker::ir::Builder::operator()(Builder *this)

{
  VarDeclStmt *in_RSI;
  
  operator()((Builder *)(&this->field_0x0 + *(long *)(*(long *)this + -0x80)),in_RSI);
  return;
}

Assistant:

void Builder::operator()(const ast::VarDeclStmt &node) const {
  auto &func = ctx.getCurFunc();
  auto name = node.identifier->val;
  auto valPtr = makeReg(name);
  ctx.appendInstFront(func.getFirstBB(), std::make_shared<Alloca>(valPtr));

  if (node.initExpr && !isNullTy(ctx.getExprType(node.initExpr->getID()))) {
    visit(*node.initExpr);
    ctx.emplaceInst<Store>(makeReg(name),
                           ctx.getExprAddr(node.initExpr->getID()));
    return;
  }
  if (isBoolTy(node.type) || isIntTy(node.type)) {
    return;
  }
  ctx.emplaceInst<Store>(makeReg(name), makeReg("@null"));
}